

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O2

_Bool borg_activate_ring(wchar_t ring_sval)

{
  ulong uVar1;
  char *what;
  long lVar2;
  borg_item_conflict *pbVar3;
  long lVar4;
  
  uVar1 = (ulong)z_info->pack_size;
  lVar2 = -0x200000000 - (uVar1 << 0x20);
  pbVar3 = borg_items + uVar1 + 2;
  lVar4 = 0;
  do {
    if (lVar4 == -1) {
LAB_002192a7:
      return (uVar1 + 2) - lVar4 < uVar1 + 3;
    }
    if ((((pbVar3->aware == true) && (pbVar3->tval == '\x15')) && ((uint)pbVar3->sval == ring_sval))
       && ((pbVar3->timeout == 0 && (pbVar3->ident == true)))) {
      what = format("# Activating ring %s.");
      borg_note(what);
      borg_keypress(0x41);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         [(long)((ulong)z_info->pack_size * -0x100000000 - lVar2) >> 0x20]);
      goto LAB_002192a7;
    }
    lVar4 = lVar4 + -1;
    lVar2 = lVar2 + -0x100000000;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

bool borg_activate_ring(int ring_sval)
{
    int i;

    /* Check the equipment */
    for (i = INVEN_RIGHT; i < INVEN_LEFT; i++) {
        borg_item *item = &borg_items[i];

        /*  Make Sure item is IDed */
        if (!item->aware)
            continue;

        /* Skip incorrect mails */
        if (item->tval != TV_RING)
            continue;
        if (item->sval != ring_sval)
            continue;

        /* Check charge */
        if (item->timeout)
            continue;

        /*  Make Sure item is IDed */
        if (!item->ident)
            continue;

        /* Log the message */
        borg_note(format("# Activating ring %s.", item->desc));

        /* Perform the action */
        borg_keypress('A');
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        /* Success */
        return true;
    }

    return false;
}